

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<40>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<40> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  int in_EAX;
  
  Base::Base(&this->super_Base,head,MAT,0x28);
  *(undefined4 *)&(this->super_Base).field_0x14 = *(undefined4 *)(head + 0x18);
  readSequence<njoy::ENDFtk::section::Type<40>::LevelBlock,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&this->levelBlocks_,(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,0x28,*(int *)(head + 0x38),*(int *)(head + 8),
             in_EAX);
  BaseWithoutMT<njoy::ENDFtk::section::Base>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,0x28);
  return;
}

Assistant:

Type( HEAD& head,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber,
      int MAT )
  try:
    Base( head, MAT, 40 ), lis_( head.L1() ),
    levelBlocks_(
      readSequence< LevelBlock >( begin, end, lineNumber,
                                  MAT, 40, head.MT(), head.N1() ) ) {
    readSEND(begin, end, lineNumber, MAT, 40 );
  } catch( std::exception& e ) {

    Log::info( "Trouble while reading section {} of File 40 of Material {}",
               head.MT(), MAT );
    throw e;
  }